

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O0

void __thiscall raft_functional_common::TestSm::~TestSm(TestSm *this)

{
  TestSm *in_RDI;
  
  ~TestSm(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

~TestSm() {}